

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynNamespaceElement * __thiscall
ParseContext::IsNamespace(ParseContext *this,SynNamespaceElement *parent,InplaceStr name)

{
  SynNamespaceElement *pSVar1;
  InplaceStr name_00;
  bool bVar2;
  SynNamespaceElement *pSVar3;
  SynNamespaceElement *unaff_R12;
  ulong uVar4;
  SynNamespaceElement *unaff_R15;
  bool bVar5;
  InplaceStr local_40;
  
  local_40.end = name.end;
  local_40.begin = name.begin;
  if (parent == (SynNamespaceElement *)0x0) {
    pSVar3 = (SynNamespaceElement *)&this->currentNamespace;
    do {
      pSVar3 = pSVar3->parent;
      bVar5 = (this->namespaceList).count != 0;
      if (bVar5) {
        uVar4 = 0;
        do {
          pSVar1 = (this->namespaceList).data[uVar4];
          if ((pSVar1->parent == pSVar3) &&
             (bVar2 = InplaceStr::operator==(&pSVar1->name->name,&local_40), bVar2)) {
            bVar2 = false;
            unaff_R15 = pSVar1;
          }
          else {
            bVar2 = true;
          }
          if (!bVar2) break;
          uVar4 = uVar4 + 1;
          bVar5 = uVar4 < (this->namespaceList).count;
        } while (bVar5);
      }
      if (bVar5) {
        return unaff_R15;
      }
    } while (pSVar3 != (SynNamespaceElement *)0x0);
  }
  else {
    bVar5 = (this->namespaceList).count != 0;
    if (bVar5) {
      uVar4 = 0;
      do {
        pSVar3 = (this->namespaceList).data[uVar4];
        if ((pSVar3->parent == parent) &&
           (bVar2 = InplaceStr::operator==(&pSVar3->name->name,&local_40), bVar2)) {
          bVar2 = false;
          unaff_R12 = pSVar3;
        }
        else {
          bVar2 = true;
        }
        if (!bVar2) break;
        uVar4 = uVar4 + 1;
        bVar5 = uVar4 < (this->namespaceList).count;
      } while (bVar5);
    }
    if (bVar5) {
      return unaff_R12;
    }
    if (parent->parent != (SynNamespaceElement *)0x0) {
      name_00.end = local_40.end;
      name_00.begin = local_40.begin;
      pSVar3 = IsNamespace(this,parent->parent,name_00);
      return pSVar3;
    }
  }
  return (SynNamespaceElement *)0x0;
}

Assistant:

SynNamespaceElement* ParseContext::IsNamespace(SynNamespaceElement *parent, InplaceStr name)
{
	// In the context of a parent namespace, we only look for immediate children
	if(parent)
	{
		// Search for existing namespace in the same context
		for(unsigned i = 0; i < namespaceList.size(); i++)
		{
			SynNamespaceElement *ns = namespaceList[i];

			if(ns->parent == parent && ns->name->name == name)
				return ns;
		}

		// Try from context of the parent namespace
		if(parent->parent)
			return IsNamespace(parent->parent, name);

		return NULL;
	}

	// Go from the bottom of the namespace stack, trying to find the namespace there
	SynNamespaceElement *current = currentNamespace;

	for(;;)
	{
		for(unsigned i = 0; i < namespaceList.size(); i++)
		{
			SynNamespaceElement *ns = namespaceList[i];

			if(ns->parent == current && ns->name->name == name)
				return ns;
		}

		if(current)
			current = current->parent;
		else
			break;
	}

	return NULL;
}